

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readBitsFromStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != nbits; uVar4 = uVar4 + 1) {
    uVar2 = *bitpointer;
    bVar1 = bitstream[uVar2 >> 3];
    *bitpointer = uVar2 + 1;
    uVar3 = uVar3 + ((bVar1 >> ((byte)uVar2 & 7) & 1) << (uVar4 & 0x1f));
  }
  return uVar3;
}

Assistant:

static unsigned readBitsFromStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
  unsigned result = 0, i;
  for(i = 0; i != nbits; ++i)
  {
    result += ((unsigned)READBIT(*bitpointer, bitstream)) << i;
    ++(*bitpointer);
  }
  return result;
}